

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model_set.c
# Opt level: O2

int32 ngram_model_set_add_ug(ngram_model_t *base,int32 wid,int32 lweight)

{
  ngram_model_t *model;
  char *word;
  int32 iVar1;
  int iVar2;
  void *__src;
  logmath_t *plVar3;
  void *pvVar4;
  ulong uVar5;
  ulong uVar6;
  int32 logb_x;
  float64 fVar7;
  int32 n_hist;
  
  __src = __ckd_calloc__((long)base[1].refcount,4,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_set.c"
                         ,0x31a);
  logb_x = base->log_zero;
  uVar6 = 0;
  do {
    if ((long)base[1].refcount <= (long)uVar6) {
      plVar3 = (logmath_t *)
               __ckd_realloc__(base[1].lmath,(long)base->n_words << 3,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_set.c"
                               ,0x341);
      base[1].lmath = plVar3;
      pvVar4 = __ckd_realloc__((plVar3->t).table,(long)base[1].refcount * (long)base->n_words * 4,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_set.c"
                               ,0x344);
      ((base[1].lmath)->t).table = pvVar4;
      uVar5 = 0;
      uVar6 = (ulong)(uint)base->n_words;
      if (base->n_words < 1) {
        uVar6 = uVar5;
      }
      for (; plVar3 = base[1].lmath, uVar6 != uVar5; uVar5 = uVar5 + 1) {
        (&(plVar3->t).table)[uVar5] =
             (void *)((long)(int)uVar5 * (long)base[1].refcount * 4 + (long)(plVar3->t).table);
      }
      memcpy((&(plVar3->t).table)[wid],__src,(long)base[1].refcount << 2);
      ckd_free(__src);
      return logb_x;
    }
    if ((ulong)*(uint *)&base[1].field_0x4 == 0xffffffff || uVar6 == *(uint *)&base[1].field_0x4) {
      iVar1 = ngram_wid(*(ngram_model_t **)(base[1].n_counts + uVar6 * 2),base->word_str[wid]);
      *(int32 *)((long)__src + uVar6 * 4) = iVar1;
      if (iVar1 == -1) {
        model = *(ngram_model_t **)(base[1].n_counts + uVar6 * 2);
        word = base->word_str[wid];
        fVar7 = logmath_exp(base->lmath,lweight);
        iVar1 = ngram_model_add_word(model,word,(float32)(float)(double)fVar7);
        *(int32 *)((long)__src + uVar6 * 4) = iVar1;
        if (iVar1 == -1) {
          ckd_free(__src);
          return base->log_zero;
        }
      }
      iVar1 = ngram_ng_prob(*(ngram_model_t **)(base[1].n_counts + uVar6 * 2),iVar1,(int32 *)0x0,0,
                            &n_hist);
      iVar2 = iVar1;
      if ((uVar6 != *(uint *)&base[1].field_0x4) &&
         (iVar2 = logb_x, *(uint *)&base[1].field_0x4 == 0xffffffff)) {
        iVar2 = logmath_add(base->lmath,logb_x,iVar1 + *(int *)(*(long *)&base[1].n + uVar6 * 4));
      }
    }
    else {
      *(undefined4 *)((long)__src + uVar6 * 4) = 0xffffffff;
      iVar2 = logb_x;
    }
    logb_x = iVar2;
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

static int32
ngram_model_set_add_ug(ngram_model_t * base, int32 wid, int32 lweight)
{
    ngram_model_set_t *set = (ngram_model_set_t *) base;
    int32 *newwid;
    int32 i, prob;

    /* At this point the word has already been added to the master
       model and we have a new word ID for it.  Add it to active
       submodels and track the word IDs. */
    newwid = ckd_calloc(set->n_models, sizeof(*newwid));
    prob = base->log_zero;
    for (i = 0; i < set->n_models; ++i) {
        int32 wprob, n_hist;

        /* Only add to active models. */
        if (set->cur == -1 || set->cur == i) {
            /* Did this word already exist? */
            newwid[i] = ngram_wid(set->lms[i], base->word_str[wid]);
            if (newwid[i] == NGRAM_INVALID_WID) {
                /* Add it to the submodel. */
                newwid[i] =
                    ngram_model_add_word(set->lms[i], base->word_str[wid],
                                         (float32) logmath_exp(base->lmath,
                                                               lweight));
                if (newwid[i] == NGRAM_INVALID_WID) {
                    ckd_free(newwid);
                    return base->log_zero;
                }
            }
            /* Now get the unigram probability for the new word and either
             * interpolate it or use it (if this is the current model). */
            wprob =
                ngram_ng_prob(set->lms[i], newwid[i], NULL, 0, &n_hist);
            if (set->cur == i)
                prob = wprob;
            else if (set->cur == -1)
                prob =
                    logmath_add(base->lmath, prob,
                                set->lweights[i] + wprob);
        }
        else {
            newwid[i] = NGRAM_INVALID_WID;
        }
    }
    /* Okay we have the word IDs for this in all the submodels.  Now
       do some complicated memory mangling to add this to the
       widmap. */
    set->widmap =
        ckd_realloc(set->widmap, base->n_words * sizeof(*set->widmap));
    set->widmap[0] =
        ckd_realloc(set->widmap[0],
                    base->n_words * set->n_models * sizeof(**set->widmap));
    for (i = 0; i < base->n_words; ++i)
        set->widmap[i] = set->widmap[0] + i * set->n_models;
    memcpy(set->widmap[wid], newwid, set->n_models * sizeof(*newwid));
    ckd_free(newwid);
    return prob;
}